

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void __thiscall amrex::ParmParse::pushPrefix(ParmParse *this,string *str)

{
  ulong uVar1;
  reference __rhs;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string s;
  reference in_stack_ffffffffffffff68;
  string local_80 [16];
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_60 [48];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __rhs = std::
            stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::top((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x11a4462);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      in_stack_ffffffffffffff68 =
           std::
           stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::top((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x11a4485);
      std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      std::operator+(in_RDI,__rhs);
      std::__cxx11::string::operator=(local_30,local_60);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_80);
    }
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)__rhs,in_stack_ffffffffffffff68);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
ParmParse::pushPrefix (const std::string& str)
{
    std::string s(str);
    if ( !s.empty() )
    {
        if ( !m_pstack.top().empty() )
        {
            s = m_pstack.top() + "." + s;
        }
        m_pstack.push(s);
    }
}